

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityAssertEqualMemory
               (void *expected,void *actual,UNITY_UINT32 length,UNITY_UINT32 num_elements,char *msg,
               UNITY_UINT lineNumber,UNITY_FLAGS_T flags)

{
  void *pvVar1;
  int iVar2;
  UNITY_UINT32 UVar3;
  void *pvVar4;
  UNITY_UINT32 UVar5;
  UNITY_UINT number;
  
  if (Unity.CurrentTestIgnored == 0 && Unity.CurrentTestFailed == 0) {
    if ((length == 0) || (num_elements == 0)) {
      UnityTestResultsFailBegin(lineNumber);
      UnityPrint(" You Asked Me To Compare Nothing, Which Was Pointless.");
LAB_00102873:
      UnityAddMsgIfSpecified(msg);
LAB_00102878:
      Unity.CurrentTestFailed = 1;
      longjmp((__jmp_buf_tag *)Unity.AbortFrame,1);
    }
    if (expected != actual) {
      iVar2 = UnityIsOneArrayNull(expected,actual,lineNumber,msg);
      pvVar4 = expected;
      UVar5 = num_elements;
      if (iVar2 != 0) goto LAB_00102878;
      while (UVar3 = UVar5 - 1, UVar5 != 0) {
        pvVar1 = (void *)((long)actual + (ulong)length);
        for (number = 0; length != (UNITY_UINT32)number; number = number + 1) {
          if (*(char *)((long)pvVar4 + number) != *(char *)((long)actual + number)) {
            UnityTestResultsFailBegin(lineNumber);
            UnityPrint(" Memory Mismatch.");
            if (1 < num_elements) {
              UnityPrint(" Element ");
              UnityPrintNumberUnsigned((ulong)(num_elements - UVar5));
            }
            UnityPrint(" Byte ");
            UnityPrintNumberUnsigned(number);
            UnityPrint(" Expected ");
            UnityPrintNumberByStyle
                      ((ulong)*(byte *)((long)pvVar4 + number),UNITY_DISPLAY_STYLE_HEX8);
            UnityPrint(" Was ");
            UnityPrintNumberByStyle
                      ((ulong)*(byte *)((long)actual + number),UNITY_DISPLAY_STYLE_HEX8);
            goto LAB_00102873;
          }
        }
        pvVar4 = (void *)((ulong)length + (long)pvVar4);
        actual = pvVar1;
        UVar5 = UVar3;
        if (flags == UNITY_ARRAY_TO_VAL) {
          pvVar4 = expected;
        }
      }
    }
  }
  return;
}

Assistant:

void UnityAssertEqualMemory(UNITY_INTERNAL_PTR expected,
                            UNITY_INTERNAL_PTR actual,
                            const UNITY_UINT32 length,
                            const UNITY_UINT32 num_elements,
                            const char* msg,
                            const UNITY_LINE_TYPE lineNumber,
                            const UNITY_FLAGS_T flags)
{
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
    UNITY_PTR_ATTRIBUTE const unsigned char* ptr_act = (UNITY_PTR_ATTRIBUTE const unsigned char*)actual;
    UNITY_UINT32 elements = num_elements;
    UNITY_UINT32 bytes;

    RETURN_IF_FAIL_OR_IGNORE;

    if ((elements == 0) || (length == 0))
    {
        UnityPrintPointlessAndBail();
    }

    if (expected == actual) return; /* Both are NULL or same pointer */
    if (UnityIsOneArrayNull(expected, actual, lineNumber, msg))
        UNITY_FAIL_AND_BAIL;

    while (elements--)
    {
        bytes = length;
        while (bytes--)
        {
            if (*ptr_exp != *ptr_act)
            {
                UnityTestResultsFailBegin(lineNumber);
                UnityPrint(UnityStrMemory);
                if (num_elements > 1)
                {
                    UnityPrint(UnityStrElement);
                    UnityPrintNumberUnsigned(num_elements - elements - 1);
                }
                UnityPrint(UnityStrByte);
                UnityPrintNumberUnsigned(length - bytes - 1);
                UnityPrint(UnityStrExpected);
                UnityPrintNumberByStyle(*ptr_exp, UNITY_DISPLAY_STYLE_HEX8);
                UnityPrint(UnityStrWas);
                UnityPrintNumberByStyle(*ptr_act, UNITY_DISPLAY_STYLE_HEX8);
                UnityAddMsgIfSpecified(msg);
                UNITY_FAIL_AND_BAIL;
            }
            ptr_exp++;
            ptr_act++;
        }
        if (flags == UNITY_ARRAY_TO_VAL)
        {
            ptr_exp = (UNITY_PTR_ATTRIBUTE const unsigned char*)expected;
        }
    }
}